

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_sprk.c
# Opt level: O1

ARKodeSPRKTable ARKodeSPRKTable_Create(int s,int q,sunrealtype *a,sunrealtype *ahat)

{
  sunrealtype *psVar1;
  sunrealtype *psVar2;
  ARKodeSPRKTable pAVar3;
  ulong uVar4;
  
  if ((ahat != (sunrealtype *)0x0 && a != (sunrealtype *)0x0) && 0 < s) {
    pAVar3 = ARKodeSPRKTable_Alloc(s);
    if (pAVar3 != (ARKodeSPRKTable)0x0) {
      pAVar3->stages = s;
      pAVar3->q = q;
      psVar1 = pAVar3->a;
      psVar2 = pAVar3->ahat;
      uVar4 = 0;
      do {
        psVar1[uVar4] = a[uVar4];
        psVar2[uVar4] = ahat[uVar4];
        uVar4 = uVar4 + 1;
      } while ((uint)s != uVar4);
      return pAVar3;
    }
  }
  return (ARKodeSPRKTable)0x0;
}

Assistant:

ARKodeSPRKTable ARKodeSPRKTable_Create(int s, int q, const sunrealtype* a,
                                       const sunrealtype* ahat)
{
  if (s < 1 || !a || !ahat) { return NULL; }

  ARKodeSPRKTable sprk_table = ARKodeSPRKTable_Alloc(s);
  if (!sprk_table) { return NULL; }

  sprk_table->stages = s;
  sprk_table->q      = q;

  for (int i = 0; i < s; i++)
  {
    sprk_table->a[i]    = a[i];
    sprk_table->ahat[i] = ahat[i];
  }

  return sprk_table;
}